

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Instruction.cc
# Opt level: O0

string * __thiscall
flow::disassemble_abi_cxx11_
          (string *__return_storage_ptr__,flow *this,Instruction pc,size_t ip,size_t sp,
          ConstantPool *cp)

{
  OperandSig OVar1;
  long lVar2;
  const_reference pvVar3;
  ostream *poVar4;
  const_reference this_00;
  const_reference this_01;
  FlowNumber __val;
  FlowString *pFVar5;
  IPAddress *this_02;
  Cidr *this_03;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar6;
  const_reference pvVar7;
  string_view format_str;
  string_view format_str_00;
  string_view format_str_01;
  string_view format_str_02;
  string_view format_str_03;
  string_view format_str_04;
  string_view format_str_05;
  unsigned_short *in_stack_fffffffffffff948;
  int *in_stack_fffffffffffff950;
  string *this_04;
  undefined1 local_69e;
  undefined1 local_69d;
  int local_520;
  undefined1 local_519;
  basic_string_view<char> local_518;
  string local_508;
  int local_4e4;
  undefined1 auStack_4e0 [4];
  int stackChange;
  string local_4d0;
  basic_string_view<char> local_4b0;
  string local_4a0;
  basic_string_view<char> local_480;
  string local_470;
  string_view local_450;
  string local_440;
  basic_string_view<char> local_420;
  string local_410;
  basic_string_view<char> local_3f0;
  string local_3e0;
  string local_3c0;
  string local_3a0;
  basic_string_view<char> local_380;
  string local_370;
  string local_350;
  string_view local_330;
  string local_320;
  string_view local_300;
  string local_2f0;
  string local_2d0;
  size_type local_2b0;
  size_t e_3;
  size_t i_3;
  vector<flow::util::Cidr,_std::allocator<flow::util::Cidr>_> *v_3;
  size_type local_278;
  size_t e_2;
  size_t i_2;
  vector<flow::util::IPAddress,_std::allocator<flow::util::IPAddress>_> *v_2;
  size_t e_1;
  size_t i_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *v_1;
  size_type local_228;
  size_t e;
  size_t i;
  vector<long,_std::allocator<long>_> *v;
  basic_string_view<char> local_200;
  undefined1 local_1f0 [8];
  string word;
  size_t n;
  stringstream line;
  ostream local_1b8 [376];
  char *local_40;
  char *mnemo;
  Operand C;
  Operand B;
  Operand A;
  Opcode opc;
  ConstantPool *cp_local;
  size_t sp_local;
  size_t ip_local;
  Instruction pc_local;
  
  _C = (ConstantPool *)sp;
  cp_local = (ConstantPool *)ip;
  sp_local = pc;
  ip_local = (size_t)this;
  pc_local = (Instruction)__return_storage_ptr__;
  mnemo._6_2_ = opcode((Instruction)this);
  mnemo._4_2_ = operandA(ip_local);
  mnemo._2_2_ = operandB(ip_local);
  mnemo._0_2_ = operandC(ip_local);
  local_40 = mnemonic(mnemo._6_2_);
  std::__cxx11::stringstream::stringstream((stringstream *)&n);
  word.field_2._8_8_ = 0;
  fmt::v5::basic_string_view<char>::basic_string_view(&local_200,"{:<10}");
  format_str.size_ = (size_t)&local_40;
  format_str.data_ = (char *)local_200.size_;
  fmt::v5::format<char_const*>((string *)local_1f0,(v5 *)local_200.data_,format_str,(char **)sp);
  std::operator<<(local_1b8,(string *)local_1f0);
  lVar2 = std::__cxx11::string::size();
  word.field_2._8_8_ = lVar2 + word.field_2._8_8_;
  if (_C == (ConstantPool *)0x0) {
    OVar1 = operandSignature(mnemo._6_2_);
    switch(OVar1) {
    case V:
      break;
    case I:
      fmt::v5::basic_string_view<char>::basic_string_view
                ((basic_string_view<char> *)auStack_4e0,"{}");
      fmt::v5::format<unsigned_short>(&local_4d0,_auStack_4e0,(unsigned_short *)((long)&mnemo + 4));
      std::__cxx11::string::operator=((string *)local_1f0,(string *)&local_4d0);
      std::__cxx11::string::~string((string *)&local_4d0);
      std::operator<<(local_1b8,(string *)local_1f0);
      lVar2 = std::__cxx11::string::size();
      word.field_2._8_8_ = lVar2 + word.field_2._8_8_;
      break;
    case II:
      fmt::v5::basic_string_view<char>::basic_string_view(&local_4b0,"{}, {}");
      format_str_04.size_ = (long)&mnemo + 4;
      format_str_04.data_ = (char *)local_4b0.size_;
      fmt::v5::format<unsigned_short,unsigned_short>
                (&local_4a0,(v5 *)local_4b0.data_,format_str_04,(unsigned_short *)((long)&mnemo + 2)
                 ,(unsigned_short *)cp);
      std::__cxx11::string::operator=((string *)local_1f0,(string *)&local_4a0);
      std::__cxx11::string::~string((string *)&local_4a0);
      std::operator<<(local_1b8,(string *)local_1f0);
      lVar2 = std::__cxx11::string::size();
      word.field_2._8_8_ = lVar2 + word.field_2._8_8_;
      break;
    case III:
      fmt::v5::basic_string_view<char>::basic_string_view(&local_480,"{}, {}, {}");
      format_str_03.size_ = (long)&mnemo + 4;
      format_str_03.data_ = (char *)local_480.size_;
      fmt::v5::format<unsigned_short,unsigned_short,unsigned_short>
                (&local_470,(v5 *)local_480.data_,format_str_03,(unsigned_short *)((long)&mnemo + 2)
                 ,(unsigned_short *)&mnemo,in_stack_fffffffffffff948);
      std::__cxx11::string::operator=((string *)local_1f0,(string *)&local_470);
      std::__cxx11::string::~string((string *)&local_470);
      std::operator<<(local_1b8,(string *)local_1f0);
      lVar2 = std::__cxx11::string::size();
      word.field_2._8_8_ = lVar2 + word.field_2._8_8_;
    }
  }
  else {
    switch(mnemo._6_2_) {
    case ITLOAD:
      std::operator<<(local_1b8,"[");
      word.field_2._8_8_ = word.field_2._8_8_ + 1;
      i = (size_t)ConstantPool::getIntArray(_C,(ulong)mnemo._4_2_);
      e = 0;
      local_228 = std::vector<long,_std::allocator<long>_>::size
                            ((vector<long,_std::allocator<long>_> *)i);
      for (; e != local_228; e = e + 1) {
        if (e != 0) {
          std::operator<<(local_1b8,", ");
          word.field_2._8_8_ = word.field_2._8_8_ + 2;
        }
        pvVar3 = std::vector<long,_std::allocator<long>_>::operator[]
                           ((vector<long,_std::allocator<long>_> *)i,e);
        std::__cxx11::to_string((string *)&v_1,*pvVar3);
        std::__cxx11::string::operator=((string *)local_1f0,(string *)&v_1);
        std::__cxx11::string::~string((string *)&v_1);
        std::operator<<(local_1b8,(string *)local_1f0);
        lVar2 = std::__cxx11::string::size();
        word.field_2._8_8_ = lVar2 + word.field_2._8_8_;
      }
      std::operator<<(local_1b8,"]");
      word.field_2._8_8_ = word.field_2._8_8_ + 1;
      break;
    case STLOAD:
      std::operator<<(local_1b8,'[');
      word.field_2._8_8_ = word.field_2._8_8_ + 1;
      i_1 = (size_t)ConstantPool::getStringArray_abi_cxx11_(_C,(ulong)mnemo._4_2_);
      e_1 = 0;
      v_2 = (vector<flow::util::IPAddress,_std::allocator<flow::util::IPAddress>_> *)
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)i_1);
      for (; (vector<flow::util::IPAddress,_std::allocator<flow::util::IPAddress>_> *)e_1 != v_2;
          e_1 = e_1 + 1) {
        if (e_1 != 0) {
          std::operator<<(local_1b8,", ");
          word.field_2._8_8_ = word.field_2._8_8_ + 2;
        }
        poVar4 = std::operator<<(local_1b8,'\"');
        pvVar7 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)i_1,e_1);
        poVar4 = std::operator<<(poVar4,(string *)pvVar7);
        std::operator<<(poVar4,'\"');
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)i_1,e_1);
        lVar2 = std::__cxx11::string::size();
        word.field_2._8_8_ = lVar2 + 2 + word.field_2._8_8_;
      }
      std::operator<<(local_1b8,']');
      word.field_2._8_8_ = word.field_2._8_8_ + 1;
      break;
    case PTLOAD:
      std::operator<<(local_1b8,"[");
      word.field_2._8_8_ = word.field_2._8_8_ + 1;
      i_2 = (size_t)ConstantPool::getIPAddressArray(_C,(ulong)mnemo._4_2_);
      e_2 = 0;
      local_278 = std::vector<flow::util::IPAddress,_std::allocator<flow::util::IPAddress>_>::size
                            ((vector<flow::util::IPAddress,_std::allocator<flow::util::IPAddress>_>
                              *)i_2);
      for (; e_2 != local_278; e_2 = e_2 + 1) {
        if (e_2 != 0) {
          std::operator<<(local_1b8,", ");
          word.field_2._8_8_ = word.field_2._8_8_ + 2;
        }
        this_00 = std::vector<flow::util::IPAddress,_std::allocator<flow::util::IPAddress>_>::
                  operator[]((vector<flow::util::IPAddress,_std::allocator<flow::util::IPAddress>_>
                              *)i_2,e_2);
        util::IPAddress::str_abi_cxx11_((string *)&v_3,this_00);
        std::__cxx11::string::operator=((string *)local_1f0,(string *)&v_3);
        std::__cxx11::string::~string((string *)&v_3);
        std::operator<<(local_1b8,(string *)local_1f0);
        lVar2 = std::__cxx11::string::size();
        word.field_2._8_8_ = lVar2 + word.field_2._8_8_;
      }
      std::operator<<(local_1b8,"]");
      word.field_2._8_8_ = word.field_2._8_8_ + 1;
      break;
    case CTLOAD:
      std::operator<<(local_1b8,"[");
      word.field_2._8_8_ = word.field_2._8_8_ + 1;
      i_3 = (size_t)ConstantPool::getCidrArray(_C,(ulong)mnemo._4_2_);
      e_3 = 0;
      local_2b0 = std::vector<flow::util::Cidr,_std::allocator<flow::util::Cidr>_>::size
                            ((vector<flow::util::Cidr,_std::allocator<flow::util::Cidr>_> *)i_3);
      for (; e_3 != local_2b0; e_3 = e_3 + 1) {
        if (e_3 != 0) {
          std::operator<<(local_1b8,", ");
          word.field_2._8_8_ = word.field_2._8_8_ + 2;
        }
        this_01 = std::vector<flow::util::Cidr,_std::allocator<flow::util::Cidr>_>::operator[]
                            ((vector<flow::util::Cidr,_std::allocator<flow::util::Cidr>_> *)i_3,e_3)
        ;
        util::Cidr::str_abi_cxx11_(&local_2d0,this_01);
        std::__cxx11::string::operator=((string *)local_1f0,(string *)&local_2d0);
        std::__cxx11::string::~string((string *)&local_2d0);
        std::operator<<(local_1b8,(string *)local_1f0);
        lVar2 = std::__cxx11::string::size();
        word.field_2._8_8_ = lVar2 + word.field_2._8_8_;
      }
      std::operator<<(local_1b8,"]");
      word.field_2._8_8_ = word.field_2._8_8_ + 1;
      break;
    case LOAD:
      fmt::v5::basic_string_view<char>::basic_string_view(&local_300,"STACK[{}]");
      fmt::v5::format<unsigned_short>(&local_2f0,local_300,(unsigned_short *)((long)&mnemo + 4));
      std::__cxx11::string::operator=((string *)local_1f0,(string *)&local_2f0);
      std::__cxx11::string::~string((string *)&local_2f0);
      std::operator<<(local_1b8,(string *)local_1f0);
      lVar2 = std::__cxx11::string::size();
      word.field_2._8_8_ = lVar2 + word.field_2._8_8_;
      break;
    case STORE:
      fmt::v5::basic_string_view<char>::basic_string_view(&local_330,"@STACK[{}]");
      fmt::v5::format<unsigned_short>(&local_320,local_330,(unsigned_short *)((long)&mnemo + 4));
      std::__cxx11::string::operator=((string *)local_1f0,(string *)&local_320);
      std::__cxx11::string::~string((string *)&local_320);
      std::operator<<(local_1b8,(string *)local_1f0);
      lVar2 = std::__cxx11::string::size();
      word.field_2._8_8_ = lVar2 + word.field_2._8_8_;
      break;
    default:
      OVar1 = operandSignature(mnemo._6_2_);
      switch(OVar1) {
      case V:
        break;
      case I:
        fmt::v5::basic_string_view<char>::basic_string_view(&local_450,"{}");
        fmt::v5::format<unsigned_short>(&local_440,local_450,(unsigned_short *)((long)&mnemo + 4));
        std::__cxx11::string::operator=((string *)local_1f0,(string *)&local_440);
        std::__cxx11::string::~string((string *)&local_440);
        std::operator<<(local_1b8,(string *)local_1f0);
        lVar2 = std::__cxx11::string::size();
        word.field_2._8_8_ = lVar2 + word.field_2._8_8_;
        break;
      case II:
        fmt::v5::basic_string_view<char>::basic_string_view(&local_420,"{}, {}");
        format_str_02.size_ = (long)&mnemo + 4;
        format_str_02.data_ = (char *)local_420.size_;
        fmt::v5::format<unsigned_short,unsigned_short>
                  (&local_410,(v5 *)local_420.data_,format_str_02,
                   (unsigned_short *)((long)&mnemo + 2),(unsigned_short *)cp);
        std::__cxx11::string::operator=((string *)local_1f0,(string *)&local_410);
        std::__cxx11::string::~string((string *)&local_410);
        std::operator<<(local_1b8,(string *)local_1f0);
        lVar2 = std::__cxx11::string::size();
        word.field_2._8_8_ = lVar2 + word.field_2._8_8_;
        break;
      case III:
        fmt::v5::basic_string_view<char>::basic_string_view(&local_3f0,"{}, {}, {}");
        format_str_01.size_ = (long)&mnemo + 4;
        format_str_01.data_ = (char *)local_3f0.size_;
        fmt::v5::format<unsigned_short,unsigned_short,unsigned_short>
                  (&local_3e0,(v5 *)local_3f0.data_,format_str_01,
                   (unsigned_short *)((long)&mnemo + 2),(unsigned_short *)&mnemo,
                   in_stack_fffffffffffff948);
        std::__cxx11::string::operator=((string *)local_1f0,(string *)&local_3e0);
        std::__cxx11::string::~string((string *)&local_3e0);
        std::operator<<(local_1b8,(string *)local_1f0);
        lVar2 = std::__cxx11::string::size();
        word.field_2._8_8_ = lVar2 + word.field_2._8_8_;
      }
      break;
    case NLOAD:
      __val = ConstantPool::getInteger(_C,(ulong)mnemo._4_2_);
      std::__cxx11::to_string(&local_350,__val);
      std::__cxx11::string::operator=((string *)local_1f0,(string *)&local_350);
      std::__cxx11::string::~string((string *)&local_350);
      std::operator<<(local_1b8,(string *)local_1f0);
      lVar2 = std::__cxx11::string::size();
      word.field_2._8_8_ = lVar2 + word.field_2._8_8_;
      break;
    case SLOAD:
      fmt::v5::basic_string_view<char>::basic_string_view(&local_380,"\"{}\"");
      pFVar5 = ConstantPool::getString_abi_cxx11_(_C,(ulong)mnemo._4_2_);
      format_str_00.size_ = (size_t)pFVar5;
      format_str_00.data_ = (char *)local_380.size_;
      fmt::v5::format<std::__cxx11::string>
                (&local_370,(v5 *)local_380.data_,format_str_00,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)sp);
      std::__cxx11::string::operator=((string *)local_1f0,(string *)&local_370);
      std::__cxx11::string::~string((string *)&local_370);
      std::operator<<(local_1b8,(string *)local_1f0);
      lVar2 = std::__cxx11::string::size();
      word.field_2._8_8_ = lVar2 + word.field_2._8_8_;
      break;
    case PLOAD:
      this_02 = ConstantPool::getIPAddress(_C,(ulong)mnemo._4_2_);
      util::IPAddress::str_abi_cxx11_(&local_3a0,this_02);
      std::__cxx11::string::operator=((string *)local_1f0,(string *)&local_3a0);
      std::__cxx11::string::~string((string *)&local_3a0);
      std::operator<<(local_1b8,(string *)local_1f0);
      lVar2 = std::__cxx11::string::size();
      word.field_2._8_8_ = lVar2 + word.field_2._8_8_;
      break;
    case CLOAD:
      this_03 = ConstantPool::getCidr(_C,(ulong)mnemo._4_2_);
      util::Cidr::str_abi_cxx11_(&local_3c0,this_03);
      std::__cxx11::string::operator=((string *)local_1f0,(string *)&local_3c0);
      std::__cxx11::string::~string((string *)&local_3c0);
      std::operator<<(local_1b8,(string *)local_1f0);
      lVar2 = std::__cxx11::string::size();
      word.field_2._8_8_ = lVar2 + word.field_2._8_8_;
      break;
    case CALL:
      pvVar6 = ConstantPool::getNativeFunctionSignatures_abi_cxx11_(_C);
      pvVar7 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](pvVar6,(ulong)mnemo._4_2_);
      std::__cxx11::string::operator=((string *)local_1f0,(string *)pvVar7);
      std::operator<<(local_1b8,(string *)local_1f0);
      lVar2 = std::__cxx11::string::size();
      word.field_2._8_8_ = lVar2 + word.field_2._8_8_;
      break;
    case HANDLER:
      pvVar6 = ConstantPool::getNativeHandlerSignatures_abi_cxx11_(_C);
      pvVar7 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](pvVar6,(ulong)mnemo._4_2_);
      std::__cxx11::string::operator=((string *)local_1f0,(string *)pvVar7);
      std::operator<<(local_1b8,(string *)local_1f0);
      lVar2 = std::__cxx11::string::size();
      word.field_2._8_8_ = lVar2 + word.field_2._8_8_;
    }
  }
  for (; (ulong)word.field_2._8_8_ < 0x23; word.field_2._8_8_ = word.field_2._8_8_ + 1) {
    std::operator<<(local_1b8,' ');
  }
  local_4e4 = getStackChange(ip_local);
  fmt::v5::basic_string_view<char>::basic_string_view(&local_518,"; ip={:>3} sp={:>2} ({}{})");
  if (local_4e4 < 1) {
    local_69e = 0x2d;
    if (-1 < local_4e4) {
      local_69e = 0x20;
    }
    local_69d = local_69e;
  }
  else {
    local_69d = 0x2b;
  }
  local_519 = local_69d;
  local_520 = local_4e4;
  if (local_4e4 < 1) {
    local_520 = -local_4e4;
  }
  format_str_05.size_ = (size_t)&sp_local;
  format_str_05.data_ = (char *)local_518.size_;
  fmt::v5::format<unsigned_long,unsigned_long,char,int>
            (&local_508,(v5 *)local_518.data_,format_str_05,(unsigned_long *)&cp_local,
             (unsigned_long *)&local_519,(char *)&local_520,in_stack_fffffffffffff950);
  this_04 = &local_508;
  std::__cxx11::string::operator=((string *)local_1f0,(string *)this_04);
  std::__cxx11::string::~string((string *)this_04);
  std::operator<<(local_1b8,(string *)local_1f0);
  std::__cxx11::stringstream::str();
  std::__cxx11::string::~string((string *)local_1f0);
  std::__cxx11::stringstream::~stringstream((stringstream *)&n);
  return __return_storage_ptr__;
}

Assistant:

std::string disassemble(Instruction pc, size_t ip, size_t sp, const ConstantPool* cp) {
  const Opcode opc = opcode(pc);
  const Operand A = operandA(pc);
  const Operand B = operandB(pc);
  const Operand C = operandC(pc);
  const char* mnemo = mnemonic(opc);
  std::stringstream line;
  size_t n = 0;

  std::string word = fmt::format("{:<10}", mnemo);
  line << word;
  n += word.size();

  // operands
  if (cp != nullptr) {
    switch (opc) {
      case Opcode::ITLOAD: {
        line << "[";
        n++;
        const std::vector<FlowNumber>& v = cp->getIntArray(A);
        for (size_t i = 0, e = v.size(); i != e; ++i) {
          if (i) {
            line << ", ";
            n += 2;
          }
          word = std::to_string(v[i]);
          line << word;
          n += word.size();
        }
        line << "]";
        n++;
        break;
      }
      case Opcode::STLOAD: {
        line << '[';
        n++;
        const std::vector<std::string>& v = cp->getStringArray(A);
        for (size_t i = 0, e = v.size(); i != e; ++i) {
          if (i) {
            line << ", ";
            n += 2;
          }
          line << '"' << v[i] << '"';
          n += v[i].size() + 2;
        }
        line << ']';
        n += 1;
        break;
      }
      case Opcode::PTLOAD: {
        line << "[";
        n++;
        const std::vector<util::IPAddress>& v = cp->getIPAddressArray(A);
        for (size_t i = 0, e = v.size(); i != e; ++i) {
          if (i) {
            line << ", ";
            n += 2;
          }
          word = v[i].str();
          line << word;
          n += word.size();
        }
        line << "]";
        n++;
        break;
      }
      case Opcode::CTLOAD: {
        line << "[";
        n++;
        const std::vector<util::Cidr>& v = cp->getCidrArray(A);
        for (size_t i = 0, e = v.size(); i != e; ++i) {
          if (i) {
            line << ", ";
            n += 2;
          }
          word = v[i].str();
          line << word;
          n += word.size();
        }
        line << "]";
        n++;
        break;
      }
      case Opcode::LOAD:
        word = fmt::format("STACK[{}]", A);
        line << word;
        n += word.size();
        break;
      case Opcode::STORE:
        word = fmt::format("@STACK[{}]", A);
        line << word;
        n += word.size();
        break;
      case Opcode::NLOAD:
        word = std::to_string(cp->getInteger(A));
        line << word;
        n += word.size();
        break;
      case Opcode::SLOAD:
        word = fmt::format("\"{}\"", cp->getString(A));
        line << word;
        n += word.size();
        break;
      case Opcode::PLOAD:
        word = cp->getIPAddress(A).str();
        line << word;
        n += word.size();
        break;
      case Opcode::CLOAD:
        word = cp->getCidr(A).str();
        line << word;
        n += word.size();
        break;
      case Opcode::CALL:
        word = cp->getNativeFunctionSignatures()[A];
        line << word;
        n += word.size();
        break;
      case Opcode::HANDLER:
        word = cp->getNativeHandlerSignatures()[A];
        line << word;
        n += word.size();
        break;
      default:
        switch (operandSignature(opc)) {
          case OperandSig::III:
            word = fmt::format("{}, {}, {}", A, B, C);
            line << word;
            n += word.size();
            break;
          case OperandSig::II:
            word = fmt::format("{}, {}", A, B);
            line << word;
            n += word.size();
            break;
          case OperandSig::I:
            word = fmt::format("{}", A);
            line << word;
            n += word.size();
            break;
          case OperandSig::V:
            break;
        }
        break;
    }
  } else {
    switch (operandSignature(opc)) {
      case OperandSig::III:
        word = fmt::format("{}, {}, {}", A, B, C);
        line << word;
        n += word.size();
        break;
      case OperandSig::II:
        word = fmt::format("{}, {}", A, B);
        line << word;
        n += word.size();
        break;
      case OperandSig::I:
        word = fmt::format("{}", A);
        line << word;
        n += word.size();
        break;
      case OperandSig::V:
        break;
    }
  }

  while (n < 35) {
    line << ' ';
    n++;
  }

  int stackChange = getStackChange(pc);

  word = fmt::format("; ip={:>3} sp={:>2} ({}{})",
                     ip, sp,
                     stackChange > 0 ? '+' :
                         stackChange < 0 ? '-' : ' ',
                     std::abs(stackChange));
  line << word;

  return line.str();
}